

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::t_of<3UL,_1024UL>::f_allocate
          (t_of<3UL,_1024UL> *this,t_heap<xemmai::t_object> *a_heap)

{
  t_object *ptVar1;
  t_object *ptVar2;
  bool bVar3;
  
  ptVar1 = (this->v_chunks)._M_b._M_p;
  do {
    ptVar2 = ptVar1;
    if (ptVar2 == (t_object *)0x0) {
      ptVar2 = f_grow(this,a_heap);
      break;
    }
    LOCK();
    ptVar1 = (this->v_chunks)._M_b._M_p;
    bVar3 = ptVar2 == ptVar1;
    if (bVar3) {
      (this->v_chunks)._M_b._M_p = ptVar2->v_previous;
      ptVar1 = ptVar2;
    }
    UNLOCK();
  } while (!bVar3);
  LOCK();
  (this->v_allocated).super___atomic_base<unsigned_long>._M_i =
       (this->v_allocated).super___atomic_base<unsigned_long>._M_i + ptVar2->v_cyclic;
  UNLOCK();
  return ptVar2;
}

Assistant:

T* f_allocate(t_heap& a_heap)
		{
			auto p = v_chunks.load(std::memory_order_acquire);
			while (p && !v_chunks.compare_exchange_weak(p, p->v_previous, std::memory_order_acquire));
			if (!p) p = f_grow(a_heap);
			v_allocated.fetch_add(p->v_cyclic, std::memory_order_relaxed);
			return p;
		}